

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressor.cpp
# Opt level: O1

void __thiscall
Imf_3_2::DwaCompressor::DwaCompressor
          (DwaCompressor *this,Header *hdr,int maxScanLineSize,int numScanLines,
          AcCompression acCompression)

{
  int iVar1;
  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>_>
  *__x;
  Box2i *pBVar2;
  float fVar3;
  
  Compressor::Compressor(&this->super_Compressor,hdr);
  (this->super_Compressor)._vptr_Compressor = (_func_int **)&PTR__DwaCompressor_003d7640;
  this->_acCompression = acCompression;
  this->_maxScanLineSize = maxScanLineSize;
  this->_numScanLines = numScanLines;
  __x = (_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>_>
         *)Header::channels(hdr);
  std::
  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>_>
  ::_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>_>
              *)&this->_channels,__x);
  this->_zip = (Zip *)0x0;
  memset(&this->_channelData,0,0x88);
  iVar1 = Header::zipCompressionLevel(hdr);
  this->_zipLevel = iVar1;
  fVar3 = Header::dwaCompressionLevel(hdr);
  this->_dwaCompressionLevel = fVar3;
  pBVar2 = Header::dataWindow(hdr);
  this->_min[0] = (pBVar2->min).x;
  pBVar2 = Header::dataWindow(hdr);
  this->_min[1] = (pBVar2->min).y;
  pBVar2 = Header::dataWindow(hdr);
  this->_max[0] = (pBVar2->max).x;
  pBVar2 = Header::dataWindow(hdr);
  this->_max[1] = (pBVar2->max).y;
  this->_planarUncBuffer[0] = (char *)0x0;
  this->_planarUncBuffer[1] = (char *)0x0;
  this->_planarUncBuffer[2] = (char *)0x0;
  this->_planarUncBufferSize[0] = 0;
  this->_planarUncBufferSize[1] = 0;
  this->_planarUncBufferSize[2] = 0;
  return;
}

Assistant:

DwaCompressor::DwaCompressor (
    const Header& hdr,
    int           maxScanLineSize,
    int           numScanLines,
    AcCompression acCompression)
    : Compressor (hdr)
    , _acCompression (acCompression)
    , _maxScanLineSize (maxScanLineSize)
    , _numScanLines (numScanLines)
    , _channels (hdr.channels ())
    , _packedAcBuffer (nullptr)
    , _packedAcBufferSize (0)
    , _packedDcBuffer (nullptr)
    , _packedDcBufferSize (0)
    , _rleBuffer (nullptr)
    , _rleBufferSize (0)
    , _outBuffer (nullptr)
    , _outBufferSize (0)
    , _zip (nullptr)
    , _zipLevel (hdr.zipCompressionLevel ())
    , _dwaCompressionLevel (hdr.dwaCompressionLevel ())
{
    _min[0] = hdr.dataWindow ().min.x;
    _min[1] = hdr.dataWindow ().min.y;
    _max[0] = hdr.dataWindow ().max.x;
    _max[1] = hdr.dataWindow ().max.y;

    for (int i = 0; i < NUM_COMPRESSOR_SCHEMES; ++i)
    {
        _planarUncBuffer[i]     = 0;
        _planarUncBufferSize[i] = 0;
    }
}